

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::GetReservedAttributesForElement(string *xml_element)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int in_stack_0000001c;
  char *in_stack_00000020;
  GTestLogSeverity in_stack_0000002c;
  GTestLog *in_stack_00000030;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *(*in_stack_ffffffffffffffe8) [8];
  
  bVar1 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (bVar1) {
    ArrayAsVector<8>(in_stack_ffffffffffffffe8);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar1) {
      ArrayAsVector<6>((char *(*) [6])in_stack_ffffffffffffffe8);
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar1) {
        ArrayAsVector<8>(in_stack_ffffffffffffffe8);
      }
      else {
        bVar1 = internal::IsTrue(false);
        if (!bVar1) {
          internal::GTestLog::GTestLog
                    (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
          poVar2 = internal::GTestLog::GetStream((GTestLog *)&stack0xffffffffffffffec);
          poVar2 = std::operator<<(poVar2,"Condition false failed. ");
          poVar2 = std::operator<<(poVar2,"Unrecognized xml_element provided: ");
          std::operator<<(poVar2,in_RSI);
          internal::GTestLog::~GTestLog((GTestLog *)poVar2);
        }
        memset(in_RDI,0,0x18);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x167c04);
      }
    }
  }
  return in_RDI;
}

Assistant:

static std::vector<std::string> GetReservedAttributesForElement(
    const std::string& xml_element) {
  if (xml_element == "testsuites") {
    return ArrayAsVector(kReservedTestSuitesAttributes);
  } else if (xml_element == "testsuite") {
    return ArrayAsVector(kReservedTestSuiteAttributes);
  } else if (xml_element == "testcase") {
    return ArrayAsVector(kReservedTestCaseAttributes);
  } else {
    GTEST_CHECK_(false) << "Unrecognized xml_element provided: " << xml_element;
  }
  // This code is unreachable but some compilers may not realizes that.
  return std::vector<std::string>();
}